

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genProductString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,
          dyn_bitset *contributingViews,prod_bitset *product)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  TDNode *pTVar4;
  Attribute *pAVar5;
  long *plVar6;
  CppGenerator *pCVar7;
  View *pVVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  long *plVar12;
  ulong uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> f_id;
  ulong uVar14;
  bool bVar15;
  CppGenerator *pCVar16;
  CppGenerator *v_id;
  long lVar17;
  ulong uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string freeVarString;
  CppGenerator *local_f0;
  undefined1 local_e0 [72];
  _Alloc_hider local_98 [2];
  char local_88 [16];
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  string local_60;
  TDNode *local_40;
  dyn_bitset *local_38;
  
  local_e0._56_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0._56_8_;
  local_e0._16_8_ = __return_storage_ptr__;
  local_78 = (element_type *)product;
  local_38 = contributingViews;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  f_id._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = node;
  do {
    if ((((_Base_bitset<24UL> *)&local_78->_root)->_M_w[(ulong)f_id._M_pi >> 6] >>
         ((ulong)f_id._M_pi & 0x3f) & 1) != 0) {
      local_68 = (element_type *)
                 QueryCompiler::getFunction
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (size_t)f_id._M_pi);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      pCVar16 = (CppGenerator *)0x2a4d5a;
      local_70._M_pi = f_id._M_pi;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60);
      uVar13 = 0;
      do {
        uVar18 = uVar13 >> 6;
        uVar14 = 1L << ((byte)uVar13 & 0x3f);
        local_e0._64_8_ = uVar13;
        if (((((var_bitset *)&local_68->_td)->super__Base_bitset<2UL>)._M_w[uVar18] >>
             (uVar13 & 0x3f) & 1) != 0) {
          if (((node->_bag).super__Base_bitset<2UL>._M_w[uVar18] & uVar14) == 0) {
            bVar15 = true;
            lVar17 = 8;
            v_id = (CppGenerator *)0x0;
            while( true ) {
              pCVar7 = (CppGenerator *)
                       QueryCompiler::numberOfViews
                                 ((this->_qc).
                                  super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
              if (pCVar7 <= v_id) break;
              if (((local_38->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(ulong)v_id >> 6] >> ((ulong)v_id & 0x3f) & 1)
                  != 0) {
                pCVar16 = v_id;
                pVVar8 = QueryCompiler::getView
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,(size_t)v_id);
                uVar13 = (pVVar8->_fVars).super__Base_bitset<2UL>._M_w[uVar18];
                if ((uVar13 & uVar14) != 0) {
                  local_98[0]._M_p = local_88;
                  lVar2 = *(long *)((long)this->viewName + lVar17 + -8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_98,lVar2,
                             *(long *)((long)&(this->viewName->_M_dataplus)._M_p + lVar17) + lVar2);
                  std::__cxx11::string::append((char *)local_98);
                  pAVar5 = TreeDecomposition::getAttribute
                                     ((this->_td).
                                      super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,local_e0._64_8_);
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)local_98,(ulong)(pAVar5->_name)._M_dataplus._M_p);
                  local_e0._24_8_ = local_e0 + 0x28;
                  plVar6 = puVar9 + 2;
                  if ((long *)*puVar9 == plVar6) {
                    local_e0._40_8_ = *plVar6;
                    local_e0._48_8_ = puVar9[3];
                  }
                  else {
                    local_e0._40_8_ = *plVar6;
                    local_e0._24_8_ = (long *)*puVar9;
                  }
                  local_e0._32_8_ = puVar9[1];
                  *puVar9 = plVar6;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append(local_e0 + 0x18);
                  local_f0 = (CppGenerator *)local_e0;
                  pCVar16 = (CppGenerator *)(plVar6 + 2);
                  if ((CppGenerator *)*plVar6 == pCVar16) {
                    local_e0._0_8_ = (pCVar16->super_CodeGenerator)._vptr_CodeGenerator;
                    local_e0._8_8_ = plVar6[3];
                  }
                  else {
                    local_e0._0_8_ = (pCVar16->super_CodeGenerator)._vptr_CodeGenerator;
                    local_f0 = (CppGenerator *)*plVar6;
                  }
                  *plVar6 = (long)pCVar16;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  pCVar16 = local_f0;
                  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_f0);
                  if (local_f0 != (CppGenerator *)local_e0) {
                    operator_delete(local_f0);
                  }
                  if ((undefined1 *)local_e0._24_8_ != local_e0 + 0x28) {
                    operator_delete((void *)local_e0._24_8_);
                  }
                  if (local_98[0]._M_p != local_88) {
                    operator_delete(local_98[0]._M_p);
                  }
                  bVar15 = false;
                }
                if ((uVar13 & uVar14) != 0) break;
              }
              v_id = (CppGenerator *)((long)&(v_id->super_CodeGenerator)._vptr_CodeGenerator + 1);
              lVar17 = lVar17 + 0x20;
            }
            pTVar4 = local_40;
            node = local_40;
            if (bVar15) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"The loop hasn\'t been found - THIS IS A MISTAKE\n",
                         0x2f);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(pTVar4->_name)._M_dataplus._M_p,
                                   (pTVar4->_name)._M_string_length);
              std::endl<char,std::char_traits<char>>(poVar10);
              pbVar11 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                        (bitset<1500UL> *)local_78);
              std::endl<char,std::char_traits<char>>(pbVar11);
              pAVar5 = TreeDecomposition::getAttribute
                                 ((this->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,local_e0._64_8_);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(pAVar5->_name)._M_dataplus._M_p,
                                   (pAVar5->_name)._M_string_length);
              std::endl<char,std::char_traits<char>>(poVar10);
              exit(1);
            }
          }
          else {
            local_98[0]._M_p = local_88;
            pcVar1 = (node->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_98,pcVar1,pcVar1 + (node->_name)._M_string_length);
            std::__cxx11::string::append((char *)local_98);
            pAVar5 = TreeDecomposition::getAttribute
                               ((this->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,local_e0._64_8_);
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_98,(ulong)(pAVar5->_name)._M_dataplus._M_p);
            local_e0._24_8_ = local_e0 + 0x28;
            plVar12 = plVar6 + 2;
            if ((long *)*plVar6 == plVar12) {
              local_e0._40_8_ = *plVar12;
              local_e0._48_8_ = plVar6[3];
            }
            else {
              local_e0._40_8_ = *plVar12;
              local_e0._24_8_ = (long *)*plVar6;
            }
            local_e0._32_8_ = plVar6[1];
            *plVar6 = (long)plVar12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append(local_e0 + 0x18);
            pCVar16 = (CppGenerator *)(plVar6 + 2);
            if ((CppGenerator *)*plVar6 == pCVar16) {
              local_e0._0_8_ = (pCVar16->super_CodeGenerator)._vptr_CodeGenerator;
              local_e0._8_8_ = plVar6[3];
              local_f0 = (CppGenerator *)local_e0;
            }
            else {
              local_e0._0_8_ = (pCVar16->super_CodeGenerator)._vptr_CodeGenerator;
              local_f0 = (CppGenerator *)*plVar6;
            }
            *plVar6 = (long)pCVar16;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            pCVar16 = local_f0;
            std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_f0);
            if (local_f0 != (CppGenerator *)local_e0) {
              operator_delete(local_f0);
            }
            if ((undefined1 *)local_e0._24_8_ != local_e0 + 0x28) {
              operator_delete((void *)local_e0._24_8_);
            }
            if (local_98[0]._M_p != local_88) {
              operator_delete(local_98[0]._M_p);
            }
          }
        }
        uVar13 = local_e0._64_8_ + 1;
      } while (uVar13 != 100);
      std::__cxx11::string::pop_back();
      getFunctionString((string *)(local_e0 + 0x18),pCVar16,(Function *)local_68,&local_60);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)(local_e0 + 0x18));
      f_id._M_pi = local_70._M_pi;
      plVar6 = puVar9 + 2;
      if ((long *)*puVar9 == plVar6) {
        local_e0._0_8_ = *plVar6;
        local_e0._8_8_ = puVar9[3];
        local_f0 = (CppGenerator *)local_e0;
      }
      else {
        local_e0._0_8_ = *plVar6;
        local_f0 = (CppGenerator *)*puVar9;
      }
      *puVar9 = plVar6;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_e0._16_8_,(ulong)local_f0);
      if (local_f0 != (CppGenerator *)local_e0) {
        operator_delete(local_f0);
      }
      if ((undefined1 *)local_e0._24_8_ != local_e0 + 0x28) {
        operator_delete((void *)local_e0._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    uVar3 = local_e0._16_8_;
    f_id._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(f_id._M_pi)->_vptr__Sp_counted_base + 1);
    if (f_id._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5dc) {
      if (*(size_type *)(local_e0._16_8_ + 8) == 0) {
        std::__cxx11::string::append((char *)local_e0._16_8_);
      }
      else {
        std::__cxx11::string::pop_back();
      }
      return (string *)uVar3;
    }
  } while( true );
}

Assistant:

std::string CppGenerator::genProductString(
    const TDNode& node, const dyn_bitset& contributingViews, const prod_bitset& product)
{
    std::string productString = "";
    // Turn each function into string
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (product[f])
        {
            Function* function = _qc->getFunction(f);
            const var_bitset& functionVars = function->_fVars;

            std::string freeVarString = "";

            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {                        
                if (functionVars[v])
                {
                    if (node._bag[v])
                    {
                        freeVarString += node._name+"Tuple."+
                            _td->getAttribute(v)->_name+",";                            
                    }
                    else
                    {
                        bool notFound = true;
                        for (size_t incViewID = 0; incViewID <
                                 _qc->numberOfViews(); ++incViewID)
                        {
                            if (contributingViews[incViewID])
                            {
                                View* incView = _qc->getView(incViewID);

                                if (incView->_fVars[v])
                                {
                                    freeVarString += viewName[incViewID]+"Tuple."+
                                        _td->getAttribute(v)->_name+",";
                                    notFound = false;
                                    break;
                                }                  
                            }
                        }

                        if (notFound)
                        {
                            ERROR("The loop hasn't been found - THIS IS A MISTAKE\n");
                            std::cout << node._name << std::endl;
                            std::cout << product << std::endl;
                            std::cout << _td->getAttribute(v)->_name << std::endl;
                            exit(1);
                        }
                    }
                }
            }

            freeVarString.pop_back();
            productString += getFunctionString(function,freeVarString)+"*";
        }
    }
            
    if (!productString.empty())
        productString.pop_back();
    else
        productString += "1";
    
    return productString;    
}